

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleTree::child(QAccessibleTree *this,int logicalIndex)

{
  bool bVar1;
  int iVar2;
  QAccessibleTableCell *this_00;
  QAbstractItemModel *pQVar3;
  uint *puVar4;
  QHeaderView *pQVar5;
  int in_ESI;
  QAccessibleTable *in_RDI;
  long in_FS_OFFSET;
  int column;
  int row;
  int index;
  QAccessibleInterface *iface;
  QAbstractItemModel *theModel;
  QAbstractItemView *theView;
  QModelIndex modelIndex;
  const_iterator id;
  QModelIndex rootIndex;
  undefined4 in_stack_ffffffffffffff08;
  Role in_stack_ffffffffffffff0c;
  QModelIndex *in_stack_ffffffffffffff10;
  QAbstractItemView *in_stack_ffffffffffffff18;
  QAccessibleTable *in_stack_ffffffffffffff20;
  QAccessibleInterface *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int local_94;
  QAccessibleInterface *local_90;
  QAccessibleInterface *local_70;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  this_00 = (QAccessibleTableCell *)QAccessibleTable::view((QAccessibleTable *)0x7f76ad);
  if (this_00 == (QAccessibleTableCell *)0x0) {
    local_70 = (QAccessibleInterface *)0x0;
  }
  else {
    pQVar3 = QAbstractItemView::model((QAbstractItemView *)in_stack_ffffffffffffff20);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_ffffffffffffff10);
    if (((local_c < 0) || (pQVar3 == (QAbstractItemModel *)0x0)) ||
       (iVar2 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_28), iVar2 == 0)) {
      local_70 = (QAccessibleInterface *)0x0;
    }
    else {
      QHash<int,_unsigned_int>::constFind
                ((QHash<int,_unsigned_int> *)in_stack_ffffffffffffff10,
                 (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      QHash<int,_unsigned_int>::constEnd((QHash<int,_unsigned_int> *)in_stack_ffffffffffffff18);
      bVar1 = QHash<int,_unsigned_int>::const_iterator::operator!=
                        ((const_iterator *)in_stack_ffffffffffffff18,
                         (const_iterator *)in_stack_ffffffffffffff10);
      if (bVar1) {
        puVar4 = QHash<int,_unsigned_int>::const_iterator::value((const_iterator *)0x7f77e1);
        local_70 = (QAccessibleInterface *)QAccessible::accessibleInterface(*puVar4);
      }
      else {
        local_90 = (QAccessibleInterface *)0x0;
        local_94 = local_c;
        pQVar5 = QAccessibleTable::horizontalHeader(in_stack_ffffffffffffff20);
        if (pQVar5 != (QHeaderView *)0x0) {
          in_stack_ffffffffffffff44 = local_c;
          iVar2 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_28);
          if (in_stack_ffffffffffffff44 < iVar2) {
            in_stack_ffffffffffffff38 = (QAccessibleInterface *)operator_new(0x20);
            QAccessibleTableHeaderCell::QAccessibleTableHeaderCell
                      ((QAccessibleTableHeaderCell *)in_stack_ffffffffffffff20,
                       in_stack_ffffffffffffff18,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       (Orientation)in_stack_ffffffffffffff10);
            local_90 = in_stack_ffffffffffffff38;
          }
          else {
            local_94 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_28);
            local_94 = local_c - local_94;
          }
        }
        if (local_90 == (QAccessibleInterface *)0x0) {
          iVar2 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_28);
          (**(code **)(*(long *)pQVar3 + 0x80))
                    (pQVar3,&local_28,(long)local_94 % (long)iVar2 & 0xffffffff);
          indexFromLogical((QAccessibleTree *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                           (int)in_stack_ffffffffffffff38);
          bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff10);
          if (!bVar1) {
            local_70 = (QAccessibleInterface *)0x0;
            goto LAB_007f7a01;
          }
          local_90 = (QAccessibleInterface *)operator_new(0x38);
          QAccessibleTable::cellRole(in_RDI);
          QAccessibleTableCell::QAccessibleTableCell
                    (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
        }
        QAccessible::registerAccessibleInterface((QAccessibleInterface *)local_90);
        QAccessible::uniqueId((QAccessibleInterface *)local_90);
        QHash<int,_unsigned_int>::insert
                  ((QHash<int,_unsigned_int> *)in_stack_ffffffffffffff10,
                   (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   (uint *)0x7f79ea);
        local_70 = local_90;
      }
    }
  }
LAB_007f7a01:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_70;
}

Assistant:

QAccessibleInterface *QAccessibleTree::child(int logicalIndex) const
{
    QAbstractItemView *theView = view();
    if (!theView)
        return nullptr;
    const QAbstractItemModel *theModel = theView->model();
    const QModelIndex rootIndex = theView->rootIndex();
    if (logicalIndex < 0 || !theModel || !theModel->columnCount(rootIndex))
        return nullptr;

    auto id = childToId.constFind(logicalIndex);
    if (id != childToId.constEnd())
        return QAccessible::accessibleInterface(id.value());

    QAccessibleInterface *iface = nullptr;
    int index = logicalIndex;

    if (horizontalHeader()) {
        if (index < theModel->columnCount(rootIndex))
            iface = new QAccessibleTableHeaderCell(theView, index, Qt::Horizontal);
        else
            index -= theModel->columnCount(rootIndex);
    }

    if (!iface) {
        const int row = index / theModel->columnCount(rootIndex);
        const int column = index % theModel->columnCount(rootIndex);
        const QModelIndex modelIndex = indexFromLogical(row, column);
        if (!modelIndex.isValid())
            return nullptr;
        iface = new QAccessibleTableCell(theView, modelIndex, cellRole());
    }
    QAccessible::registerAccessibleInterface(iface);
    childToId.insert(logicalIndex, QAccessible::uniqueId(iface));
    return iface;
}